

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

void pstack::
     print_container<std::vector<pstack::Dwarf::LineState,std::allocator<pstack::Dwarf::LineState>>,char_const&>
               (ostream *os,long *container,char *ctx)

{
  LineState *pLVar1;
  size_t sVar2;
  char *__s;
  LineState *field;
  LineState *pLVar3;
  JSON<pstack::Dwarf::LineState,_char> local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  pLVar3 = (LineState *)*container;
  pLVar1 = (LineState *)container[1];
  if (pLVar3 != pLVar1) {
    __s = "";
    do {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
      local_40.object = pLVar3;
      local_40.context = ctx;
      operator<<(os,&local_40);
      pLVar3 = pLVar3 + 1;
      __s = ",\n";
    } while (pLVar3 != pLVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}